

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

iterator __thiscall QUrlQueryPrivate::findKey(QUrlQueryPrivate *this,QString *key)

{
  long lVar1;
  iterator iVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffff88;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffff90;
  int from;
  QString *key_00;
  QUrlQueryPrivate *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffd0;
  QUrlQueryPrivate *in_stack_ffffffffffffffd8;
  
  from = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<std::pair<QString,_QString>_>::begin(in_stack_ffffffffffffff90);
  key_00 = (QString *)&stack0xffffffffffffffd8;
  recodeFromUser(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  findRecodedKey(in_stack_ffffffffffffffa8,key_00,from);
  iVar2 = QList<std::pair<QString,_QString>_>::iterator::operator+
                    ((iterator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x3177ba);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)iVar2.i;
  }
  __stack_chk_fail();
}

Assistant:

Map::iterator findKey(const QString &key)
    { return itemList.begin() + findRecodedKey(recodeFromUser(key)); }